

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O1

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_zone_visual>::create
          (factory_item<xray_re::cse_alife_zone_visual> *this)

{
  cse_alife_space_restrictor *pcVar1;
  cse_alife_anomalous_zone *this_00;
  
  this_00 = (cse_alife_anomalous_zone *)operator_new(0x1d0);
  xray_re::cse_alife_anomalous_zone::cse_alife_anomalous_zone(this_00);
  xray_re::cse_visual::cse_visual((cse_visual *)(this_00 + 1));
  (this_00->super_cse_alife_custom_zone).super_cse_alife_space_restrictor.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_zone_visual_00247aa8;
  (this_00->super_cse_alife_custom_zone).super_cse_alife_space_restrictor.super_cse_shape.
  _vptr_cse_shape = (_func_int **)&PTR__cse_alife_zone_visual_00247b10;
  this_00[1].super_cse_alife_custom_zone.super_cse_alife_space_restrictor.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__cse_alife_zone_visual_00247b38;
  *(fvector3 **)
   ((long)&this_00[1].super_cse_alife_custom_zone.super_cse_alife_space_restrictor.
           super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_s_name.field_2
   + 8) = &this_00[1].super_cse_alife_custom_zone.super_cse_alife_space_restrictor.
           super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_o_position;
  pcVar1 = &this_00[1].super_cse_alife_custom_zone.super_cse_alife_space_restrictor;
  (pcVar1->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.m_s_game_id =
       '\0';
  (pcVar1->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.m_s_rp = '\0';
  (pcVar1->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.m_s_flags = 0;
  (pcVar1->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.m_cs_unk1_u16 =
       0;
  *(undefined2 *)
   &(pcVar1->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.field_0x5e =
       0;
  *(undefined1 *)
   &this_00[1].super_cse_alife_custom_zone.super_cse_alife_space_restrictor.
    super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_o_position.field_0 =
       0;
  (this_00->super_cse_alife_custom_zone).super_cse_alife_space_restrictor.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_clsid.field_0 =
       (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}